

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

FButtonStatus * FindButton(uint key)

{
  FActionMap *pFVar1;
  FButtonStatus *local_20;
  FActionMap *bit;
  uint key_local;
  
  pFVar1 = BinarySearch<FActionMap,unsigned_int>(ActionMaps,0x20,8,key);
  if (pFVar1 == (FActionMap *)0x0) {
    local_20 = (FButtonStatus *)0x0;
  }
  else {
    local_20 = pFVar1->Button;
  }
  return local_20;
}

Assistant:

FButtonStatus *FindButton (unsigned int key)
{
	const FActionMap *bit;

	bit = BinarySearch<FActionMap, unsigned int>
			(ActionMaps, NUM_ACTIONS, &FActionMap::Key, key);
	return bit ? bit->Button : NULL;
}